

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O1

int __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>_>
::access(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>_>
         *this,char *__name,int __type)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int extraout_EAX;
  uint uVar4;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  char cVar5;
  byte bVar6;
  
  uVar2 = (uint)__name;
  if ((uVar2 + 0x3d00 & 0xffff) < 0xd00) {
    bVar6 = 0;
    if ((uVar2 & 0xcf00) == 0xc300) {
      bVar6 = (this->switches_).slot_C3_rom ^ 1;
    }
    (this->switches_).internal_C8_rom =
         (uVar2 & 0xffff) != 0xcfff && ((this->switches_).internal_C8_rom != false || bVar6 != 0);
    set_card_paging(this);
    return extraout_EAX;
  }
  uVar4 = uVar2 + 0x3fa8;
  if (0xffa7 < (ushort)uVar4) {
    uVar3 = uVar2 & 0xffff;
    bVar6 = (byte)__name;
    uVar4 = 0x4b4704;
    cVar5 = (char)__type;
    switch(uVar3) {
    case 0xc000:
    case 0xc001:
      if (cVar5 == '\0') {
        (this->switches_).store_80 = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_00;
      }
      break;
    case 0xc002:
    case 0xc003:
      if (cVar5 == '\0') {
        (this->switches_).read_auxiliary_memory = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_06;
      }
      break;
    case 0xc004:
    case 0xc005:
      if (cVar5 == '\0') {
        (this->switches_).write_auxiliary_memory = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_03;
      }
      break;
    case 0xc006:
    case 0xc007:
      if (cVar5 == '\0') {
        (this->switches_).internal_CX_rom = (bool)(bVar6 & 1);
        set_card_paging(this);
        return extraout_EAX_04;
      }
      break;
    case 0xc008:
    case 0xc009:
      if (cVar5 == '\0') {
        bVar1 = (this->switches_).alternative_zero_page;
        uVar4 = (uint)bVar1;
        if ((uVar2 & 1) != (uint)bVar1) {
          (this->switches_).alternative_zero_page = SUB41(uVar2 & 1,0);
          ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_false>::set_paging<2>
                    (this->machine_);
          return extraout_EAX_02;
        }
      }
      break;
    case 0xc00a:
    case 0xc00b:
      if (cVar5 == '\0') {
        (this->switches_).slot_C3_rom = (bool)(bVar6 & 1);
        set_card_paging(this);
        return extraout_EAX_07;
      }
      break;
    default:
      if (uVar3 - 0xc054 < 2) {
        (this->switches_).video_page_2 = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_05;
      }
      uVar4 = uVar3 - 0xc056;
      if (uVar4 < 2) {
        (this->switches_).high_resolution = (bool)(bVar6 & 1);
        set_main_paging(this);
        return extraout_EAX_01;
      }
    }
  }
  return uVar4;
}

Assistant:

void access(uint16_t address, bool is_read) {
			if(address >= 0xc300 && address < 0xd000) {
				switches_.internal_C8_rom |= ((address >> 8) == 0xc3) && !switches_.slot_C3_rom;
				switches_.internal_C8_rom &= (address != 0xcfff);
				set_card_paging();
				return;
			}

			if(address < 0xc000 || address >= 0xc058) return;

			switch(address) {
				default: break;

				case 0xc000: case 0xc001:
					if(!is_read) {
						switches_.store_80 = address & 1;
						set_main_paging();
					}
				break;

				case 0xc002: case 0xc003:
					if(!is_read) {
						switches_.read_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc004: case 0xc005:
					if(!is_read) {
						switches_.write_auxiliary_memory = address & 1;
						set_main_paging();
					}
				break;

				case 0xc006: case 0xc007:
					if(!is_read) {
						switches_.internal_CX_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc008: case 0xc009: {
					const bool alternative_zero_page = address & 1;
					if(!is_read && switches_.alternative_zero_page != alternative_zero_page) {
						switches_.alternative_zero_page = alternative_zero_page;
						set_zero_page_paging();
					}
				} break;

				case 0xc00a: case 0xc00b:
					if(!is_read) {
						switches_.slot_C3_rom = address & 1;
						set_card_paging();
					}
				break;

				case 0xc054: case 0xc055:
					switches_.video_page_2 = address & 1;
					set_main_paging();
				break;

				case 0xc056: case 0xc057:
					switches_.high_resolution = address & 1;
					set_main_paging();
				break;
			}
		}